

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O2

int ffp3dujj(fitsfile *fptr,long group,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,LONGLONG naxis2
            ,LONGLONG naxis3,ULONGLONG *array,int *status)

{
  int iVar1;
  long lVar2;
  long lVar3;
  LONGLONG LVar4;
  long lVar5;
  ULONGLONG *array_00;
  LONGLONG firstelem;
  bool bVar6;
  
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    firstelem = 1;
    if (group < 2) {
      group = firstelem;
    }
    if (nrows == naxis2 && ncols == naxis1) {
      ffpclujj(fptr,2,group,1,nrows * ncols * naxis3,array,status);
      iVar1 = *status;
    }
    else if (nrows < naxis2 || ncols < naxis1) {
      *status = 0x140;
      iVar1 = 0x140;
    }
    else {
      lVar2 = 0;
      LVar4 = naxis2;
      if (naxis2 < 1) {
        LVar4 = lVar2;
      }
      if (naxis3 < 1) {
        naxis3 = lVar2;
      }
      lVar3 = 0;
      while( true ) {
        if (lVar2 == naxis3) break;
        array_00 = array + lVar3;
        lVar3 = lVar3 + (nrows - naxis2) * ncols;
        lVar5 = LVar4;
        while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
          iVar1 = ffpclujj(fptr,2,group,firstelem,naxis1,array_00,status);
          if (0 < iVar1) goto LAB_0019da5a;
          firstelem = firstelem + naxis1;
          lVar3 = lVar3 + ncols;
          array_00 = array_00 + ncols;
        }
        lVar2 = lVar2 + 1;
      }
LAB_0019da5a:
      iVar1 = *status;
    }
  }
  else {
    ffpmsg("writing TULONGLONG to compressed image is not supported");
    *status = 0x19d;
    iVar1 = 0x19d;
  }
  return iVar1;
}

Assistant:

int ffp3dujj(fitsfile *fptr,   /* I - FITS file pointer                    */
           long  group,      /* I - group to write(1 = 1st group)         */
           LONGLONG  ncols,      /* I - number of pixels in each row of array */
           LONGLONG  nrows,      /* I - number of rows in each plane of array */
           LONGLONG  naxis1,     /* I - FITS image NAXIS1 value               */
           LONGLONG  naxis2,     /* I - FITS image NAXIS2 value               */
           LONGLONG  naxis3,     /* I - FITS image NAXIS3 value               */
           ULONGLONG  *array,    /* I - array to be written                   */
           int  *status)     /* IO - error status                         */
/*
  Write an entire 3-D cube of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).
*/
{
    long tablerow, ii, jj;
    long fpixel[3]= {1,1,1}, lpixel[3];
    LONGLONG nfits, narray;
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
           
    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing TULONGLONG to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
      /* all the image pixels are contiguous, so write all at once */
      ffpclujj(fptr, 2, tablerow, 1L, naxis1 * naxis2 * naxis3, array, status);
      return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to write to */
    narray = 0;  /* next pixel in input array to be written */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* writing naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffpclujj(fptr, 2, tablerow, nfits, naxis1,&array[narray],status) > 0)
         return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }
    return(*status);
}